

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 matchOther)

{
  byte bVar1;
  byte bVar2;
  u8 uVar3;
  uint uVar4;
  u32 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte *zString_00;
  size_t sVar9;
  u32 uVar10;
  u32 uVar11;
  ulong uVar12;
  u8 *puVar13;
  byte *pbVar14;
  long in_FS_OFFSET;
  bool bVar15;
  u8 *local_58;
  byte *local_50;
  u8 *zPattern_local;
  char local_3b;
  uchar local_3a;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = pInfo->matchOne;
  uVar4 = (uint)bVar1;
  bVar2 = pInfo->matchAll;
  uVar3 = pInfo->noCase;
  local_58 = (u8 *)0x0;
  uVar8 = 1;
  local_50 = zString;
  zPattern_local = zPattern;
LAB_00126b21:
  do {
    uVar11 = (u32)(char)*zPattern_local;
    if ((char)*zPattern_local < '\0') {
      uVar11 = sqlite3Utf8Read(&zPattern_local);
    }
    else {
      zPattern_local = zPattern_local + 1;
    }
    if (uVar11 == 0) {
      uVar8 = (uint)(*local_50 != 0);
      goto LAB_00126eb1;
    }
    if (uVar11 == bVar2) {
      break;
    }
    if (uVar11 == matchOther) {
      if (pInfo->matchSet == '\0') {
        uVar11 = sqlite3Utf8Read(&zPattern_local);
        if (uVar11 != 0) {
          local_58 = zPattern_local;
          goto LAB_00126be5;
        }
      }
      else {
        uVar11 = sqlite3Utf8Read(&local_50);
        if (uVar11 != 0) {
          uVar5 = sqlite3Utf8Read(&zPattern_local);
          uVar10 = 0;
          bVar15 = uVar5 == 0x5e;
          if (bVar15) {
            uVar5 = sqlite3Utf8Read(&zPattern_local);
          }
          uVar6 = 0;
          if (uVar5 != 0x5d) goto LAB_00126c77;
          uVar6 = (uint)(uVar11 == 0x5d);
LAB_00126c68:
          uVar10 = 0;
LAB_00126c6a:
          uVar5 = sqlite3Utf8Read(&zPattern_local);
LAB_00126c77:
          if (uVar5 == 0x2d) {
            if ((*zPattern_local != ']') && (uVar10 != 0 && *zPattern_local != '\0'))
            goto code_r0x00126cb5;
          }
          else {
            if (uVar5 == 0x5d) {
              if (uVar6 == bVar15) goto LAB_00126eb1;
              goto LAB_00126b21;
            }
            if (uVar5 == 0) goto LAB_00126eb1;
          }
          uVar10 = uVar5;
          if (uVar11 == uVar5) {
            uVar6 = 1;
          }
          goto LAB_00126c6a;
        }
      }
      goto LAB_00126eb1;
    }
LAB_00126be5:
    uVar6 = (uint)(char)*local_50;
    if ((char)*local_50 < '\0') {
      uVar6 = sqlite3Utf8Read(&local_50);
    }
    else {
      local_50 = local_50 + 1;
    }
    if (((uVar11 != uVar6) &&
        (((uVar3 == '\0' || (0x7f < (uVar6 | uVar11))) || (""[uVar11 & 0xff] != ""[uVar6 & 0xff]))))
       && (((uVar11 != uVar4 || (uVar6 == 0)) || (zPattern_local == local_58)))) goto LAB_00126eb1;
  } while( true );
  while ((uVar6 != uVar4 || (uVar11 = sqlite3Utf8Read(&local_50), uVar11 != 0))) {
    uVar6 = (uint)(char)*zPattern_local;
    if ((int)uVar6 < 0) {
      uVar6 = sqlite3Utf8Read(&zPattern_local);
    }
    else {
      zPattern_local = zPattern_local + 1;
    }
    if ((uVar6 != bVar2) && (bVar1 == 0 || uVar6 != uVar4)) {
      if (uVar6 == 0) {
        uVar8 = 0;
        goto LAB_00126eb1;
      }
      if (uVar6 == matchOther) {
        if (pInfo->matchSet != '\0') {
          puVar13 = zPattern_local + -1;
          pbVar14 = local_50;
          goto LAB_00126d70;
        }
        uVar6 = sqlite3Utf8Read(&zPattern_local);
        if (uVar6 == 0) break;
      }
      puVar13 = zPattern_local;
      uVar12 = (ulong)uVar6;
      if (0x7f < uVar6) {
        goto LAB_00126e14;
      }
      local_39 = 0xaa;
      if (uVar3 == '\0') {
        local_3a = '\0';
      }
      else {
        local_3a = ""[uVar12];
        local_39 = 0;
        uVar12 = (ulong)(byte)((byte)uVar6 & (~""[uVar12] | 0xdf));
      }
      local_3b = (char)uVar12;
      pbVar14 = local_50;
      goto LAB_00126e79;
    }
  }
  goto LAB_00126d43;
  while ((uVar8 != uVar6 || (uVar8 = patternCompare(puVar13,local_50,pInfo,matchOther), uVar8 == 1))
        ) {
LAB_00126e14:
    uVar8 = (uint)(char)*local_50;
    if ((char)*local_50 < '\0') {
      uVar8 = sqlite3Utf8Read(&local_50);
    }
    else {
      local_50 = local_50 + 1;
    }
    if (uVar8 == 0) goto LAB_00126d43;
  }
  goto LAB_00126eb1;
  while( true ) {
    pbVar14 = pbVar14 + sVar9 + 1;
    uVar8 = patternCompare(puVar13,pbVar14,pInfo,matchOther);
    if (uVar8 != 1) break;
LAB_00126e79:
    sVar9 = strcspn((char *)pbVar14,&local_3b);
    if (pbVar14[sVar9] == 0) goto LAB_00126d43;
  }
  goto LAB_00126eb1;
code_r0x00126cb5:
  uVar5 = sqlite3Utf8Read(&zPattern_local);
  uVar7 = uVar8;
  if (uVar5 < uVar11) {
    uVar7 = uVar6;
  }
  if (uVar10 <= uVar11) {
    uVar6 = uVar7;
  }
  goto LAB_00126c68;
LAB_00126d70:
  zString_00 = pbVar14;
  bVar1 = *zString_00;
  if (bVar1 != 0) {
    uVar8 = patternCompare(puVar13,zString_00,pInfo,matchOther);
    if (uVar8 != 1) goto LAB_00126eb1;
    pbVar14 = zString_00 + 1;
    if (0xbf < bVar1) {
      pbVar14 = zString_00 + 1;
    }
    goto LAB_00126d70;
  }
LAB_00126d43:
  uVar8 = 2;
LAB_00126eb1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar8;
  }
  __stack_chk_fail();
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 matchOther                   /* The escape char (LIKE) or '[' (GLOB) */
){
  u32 c, c2;                       /* Next pattern and input string chars */
  u32 matchOne = pInfo->matchOne;  /* "?" or "_" */
  u32 matchAll = pInfo->matchAll;  /* "*" or "%" */
  u8 noCase = pInfo->noCase;       /* True if uppercase==lowercase */
  const u8 *zEscaped = 0;          /* One past the last escaped input char */

  while( (c = Utf8Read(zPattern))!=0 ){
    if( c==matchAll ){  /* Match "*" */
      /* Skip over multiple "*" characters in the pattern.  If there
      ** are also "?" characters, skip those as well, but consume a
      ** single character of the input string for each "?" skipped */
      while( (c=Utf8Read(zPattern)) == matchAll
             || (c == matchOne && matchOne!=0) ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return SQLITE_NOWILDCARDMATCH;
        }
      }
      if( c==0 ){
        return SQLITE_MATCH;   /* "*" at the end of the pattern matches */
      }else if( c==matchOther ){
        if( pInfo->matchSet==0 ){
          c = sqlite3Utf8Read(&zPattern);
          if( c==0 ) return SQLITE_NOWILDCARDMATCH;
        }else{
          /* "[...]" immediately follows the "*".  We have to do a slow
          ** recursive search in this case, but it is an unusual case. */
          assert( matchOther<0x80 );  /* '[' is a single-byte character */
          while( *zString ){
            int bMatch = patternCompare(&zPattern[-1],zString,pInfo,matchOther);
            if( bMatch!=SQLITE_NOMATCH ) return bMatch;
            SQLITE_SKIP_UTF8(zString);
          }
          return SQLITE_NOWILDCARDMATCH;
        }
      }

      /* At this point variable c contains the first character of the
      ** pattern string past the "*".  Search in the input string for the
      ** first matching character and recursively continue the match from
      ** that point.
      **
      ** For a case-insensitive search, set variable cx to be the same as
      ** c but in the other case and search the input string for either
      ** c or cx.
      */
      if( c<0x80 ){
        char zStop[3];
        int bMatch;
        if( noCase ){
          zStop[0] = sqlite3Toupper(c);
          zStop[1] = sqlite3Tolower(c);
          zStop[2] = 0;
        }else{
          zStop[0] = c;
          zStop[1] = 0;
        }
        while(1){
          zString += strcspn((const char*)zString, zStop);
          if( zString[0]==0 ) break;
          zString++;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }else{
        int bMatch;
        while( (c2 = Utf8Read(zString))!=0 ){
          if( c2!=c ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }
      return SQLITE_NOWILDCARDMATCH;
    }
    if( c==matchOther ){
      if( pInfo->matchSet==0 ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ) return SQLITE_NOMATCH;
        zEscaped = zPattern;
      }else{
        u32 prior_c = 0;
        int seen = 0;
        int invert = 0;
        c = sqlite3Utf8Read(&zString);
        if( c==0 ) return SQLITE_NOMATCH;
        c2 = sqlite3Utf8Read(&zPattern);
        if( c2=='^' ){
          invert = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==']' ){
          if( c==']' ) seen = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        while( c2 && c2!=']' ){
          if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
            c2 = sqlite3Utf8Read(&zPattern);
            if( c>=prior_c && c<=c2 ) seen = 1;
            prior_c = 0;
          }else{
            if( c==c2 ){
              seen = 1;
            }
            prior_c = c2;
          }
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==0 || (seen ^ invert)==0 ){
          return SQLITE_NOMATCH;
        }
        continue;
      }
    }
    c2 = Utf8Read(zString);
    if( c==c2 ) continue;
    if( noCase  && sqlite3Tolower(c)==sqlite3Tolower(c2) && c<0x80 && c2<0x80 ){
      continue;
    }
    if( c==matchOne && zPattern!=zEscaped && c2!=0 ) continue;
    return SQLITE_NOMATCH;
  }
  return *zString==0 ? SQLITE_MATCH : SQLITE_NOMATCH;
}